

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O0

Machine * putStructure(Machine *__return_storage_ptr__,Machine *m,Register r,Functor *f)

{
  mapped_type *pmVar1;
  Hcell *pHVar2;
  mapped_type *this;
  key_type local_cc;
  Functor local_c8;
  Hcell local_a0;
  int local_5c;
  Hcell local_58;
  Functor *local_28;
  Functor *f_local;
  Machine *m_local;
  Machine *pMStack_10;
  Register r_local;
  
  local_28 = f;
  f_local = (Functor *)m;
  m_local._4_4_ = r.r;
  pMStack_10 = __return_storage_ptr__;
  local_5c = (int)Hix::operator+(&m->h,1);
  Hcell::str(&local_58,(Hix)local_5c);
  pmVar1 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
           operator[](&m->heap,&m->h);
  pHVar2 = Hcell::operator=(pmVar1,&local_58);
  this = std::
         map<Register,_Hcell,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
         ::operator[](&m->regval,(key_type *)((long)&m_local + 4));
  Hcell::operator=(this,pHVar2);
  Hcell::~Hcell(&local_58);
  Functor::Functor(&local_c8,f);
  Hcell::functor(&local_a0,&local_c8);
  local_cc.hix = (int)Hix::operator+(&m->h,1);
  pmVar1 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
           operator[](&m->heap,&local_cc);
  Hcell::operator=(pmVar1,&local_a0);
  Hcell::~Hcell(&local_a0);
  Functor::~Functor(&local_c8);
  Hix::operator+=(&m->h,2);
  Machine::Machine(__return_storage_ptr__,m);
  return __return_storage_ptr__;
}

Assistant:

Machine putStructure(Machine m, Register r, Functor f) {
    m.regval[r] = m.heap[m.h] = Hcell::str(m.h + 1);
    m.heap[m.h + 1] = Hcell::functor(f);
    m.h += 2;
    return m;
}